

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O3

void test_common<signed_char>(uint length,char value)

{
  ulong __n;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> __s;
  uint i;
  int iVar2;
  ulong uVar3;
  undefined8 *puVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  shared_ptr<signed_char> pa;
  shared_ptr<signed_char> pb;
  
  __n = (ulong)length;
  iVar2 = posix_memalign(&pa.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                          ._M_pi,0x40,(long)(int)(length + 1));
  local_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar2 == 0) {
    local_50 = pa.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<signed_char*,void(*)(signed_char*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa,local_50,
             sse::common::free<signed_char>);
  iVar2 = posix_memalign(&local_58,0x40,(long)(int)(length + 1));
  pa.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar2 == 0) {
    pa.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_58;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<signed_char*,void(*)(signed_char*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb,
             pa.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             sse::common::free<signed_char>);
  __s._M_pi = pa.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var1 = local_50;
  *(undefined1 *)((long)&local_50->_vptr__Sp_counted_base + __n) = 0x7f;
  *(undefined1 *)
   ((long)&(pa.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + __n) = 0x3f;
  if ((int)length < 1) {
    if (length == 0) goto LAB_0010599f;
  }
  else {
    memset(local_50,(uint)(byte)value,__n);
  }
  uVar3 = 0;
  do {
    if (*(char *)((long)&p_Var1->_vptr__Sp_counted_base + uVar3) != value) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_common(unsigned int, T) [T = signed char]";
      *(undefined4 *)(puVar4 + 1) = 0x16;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
    uVar3 = uVar3 + 1;
  } while (__n != uVar3);
  if (0 < (int)length) {
    uVar3 = 0;
    do {
      *(undefined1 *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + uVar3) =
           *(undefined1 *)((long)&p_Var1->_vptr__Sp_counted_base + uVar3);
      uVar3 = uVar3 + 1;
    } while (__n != uVar3);
  }
  uVar3 = 0;
  do {
    if (*(char *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + uVar3) != value) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_common(unsigned int, T) [T = signed char]";
      *(undefined4 *)(puVar4 + 1) = 0x1d;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
    uVar3 = uVar3 + 1;
  } while (__n != uVar3);
  if (0 < (int)length) {
    memset(__s._M_pi,0,__n);
  }
  uVar3 = 0;
  do {
    if (*(char *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + uVar3) != '\0') {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_common(unsigned int, T) [T = signed char]";
      *(undefined4 *)(puVar4 + 1) = 0x24;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
    uVar3 = uVar3 + 1;
  } while (__n != uVar3);
  uVar3 = 0;
  do {
    *(char *)((long)&p_Var1->_vptr__Sp_counted_base + uVar3) = (char)uVar3;
    uVar3 = uVar3 + 1;
  } while (__n != uVar3);
  if (0 < (int)length) {
    uVar3 = 0;
    do {
      *(undefined1 *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + uVar3) =
           *(undefined1 *)((long)&p_Var1->_vptr__Sp_counted_base + uVar3);
      uVar3 = uVar3 + 1;
    } while (__n != uVar3);
  }
  iVar2 = 0;
  uVar3 = 0;
  do {
    if (iVar2 >> 0x18 != (int)*(char *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + uVar3)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = "void test_common(unsigned int, T) [T = signed char]";
      *(undefined4 *)(puVar4 + 1) = 0x2d;
      *(uint *)((long)puVar4 + 0xc) = length;
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
    uVar3 = uVar3 + 1;
    iVar2 = iVar2 + 0x1000000;
  } while (__n != uVar3);
LAB_0010599f:
  if ((*(char *)((long)&p_Var1->_vptr__Sp_counted_base + __n) == '\x7f') &&
     (*(char *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + __n) == '?')) {
    if (pb.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
       ) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pb.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (pa.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
       ) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pa.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    return;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar4 = "void test_common(unsigned int, T) [T = signed char]";
  *(undefined4 *)(puVar4 + 1) = 0x31;
  *(uint *)((long)puVar4 + 0xc) = length;
  __cxa_throw(puVar4,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}